

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall iqxmlrpc::http::Packet::~Packet(Packet *this)

{
  this->_vptr_Packet = (_func_int **)&PTR__Packet_0019cb98;
  std::__cxx11::string::~string((string *)&this->content_);
  boost::detail::shared_count::~shared_count(&(this->header_).pn);
  return;
}

Assistant:

Packet::~Packet()
{
}